

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::number::impl::NumberStringBuilder::toDebugString
          (UnicodeString *__return_storage_ptr__,NumberStringBuilder *this)

{
  ValueOrHeapArray<char16_t> *pVVar1;
  ValueOrHeapArray<UNumberFormatFields> *pVVar2;
  long lVar3;
  UnicodeString local_70;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003c0258;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  UnicodeString::doAppend(__return_storage_ptr__,L"<NumberStringBuilder [",0,-1);
  if (this->fUsingHeap == false) {
    pVVar1 = &this->fChars;
  }
  else {
    pVVar1 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
  }
  UnicodeString::UnicodeString(&local_70,pVVar1->value + this->fZero,this->fLength);
  if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
    local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend(__return_storage_ptr__,&local_70,0,local_70.fUnion.fFields.fLength);
  UnicodeString::~UnicodeString(&local_70);
  UnicodeString::doAppend(__return_storage_ptr__,L"] [",0,-1);
  if (0 < this->fLength) {
    lVar3 = 0;
    do {
      pVVar2 = &this->fFields;
      if (this->fUsingHeap != false) {
        pVVar2 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      }
      switch(pVVar2->value[this->fZero + lVar3]) {
      case UNUM_INTEGER_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x69;
        break;
      case UNUM_FRACTION_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x66;
        break;
      case UNUM_DECIMAL_SEPARATOR_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x2e;
        break;
      case UNUM_EXPONENT_SYMBOL_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x45;
        break;
      case UNUM_EXPONENT_SIGN_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x2b;
        break;
      case UNUM_EXPONENT_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x65;
        break;
      case UNUM_GROUPING_SEPARATOR_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x2c;
        break;
      case UNUM_CURRENCY_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x24;
        break;
      case UNUM_PERCENT_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x25;
        break;
      case UNUM_PERMILL_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x2030;
        break;
      case UNUM_SIGN_FIELD:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x2d;
        break;
      case UNUM_FIELD_COUNT:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x6e;
        UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&local_70,0,1);
        goto LAB_0026e812;
      default:
        local_70.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x3f;
      }
      UnicodeString::doAppend(__return_storage_ptr__,(UChar *)&local_70,0,1);
LAB_0026e812:
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 < this->fLength);
  }
  UnicodeString::doAppend(__return_storage_ptr__,L"]>",0,-1);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString NumberStringBuilder::toDebugString() const {
    UnicodeString sb;
    sb.append(u"<NumberStringBuilder [", -1);
    sb.append(toUnicodeString());
    sb.append(u"] [", -1);
    for (int i = 0; i < fLength; i++) {
        if (fieldAt(i) == UNUM_FIELD_COUNT) {
            sb.append(u'n');
        } else {
            char16_t c;
            switch (fieldAt(i)) {
                case UNUM_SIGN_FIELD:
                    c = u'-';
                    break;
                case UNUM_INTEGER_FIELD:
                    c = u'i';
                    break;
                case UNUM_FRACTION_FIELD:
                    c = u'f';
                    break;
                case UNUM_EXPONENT_FIELD:
                    c = u'e';
                    break;
                case UNUM_EXPONENT_SIGN_FIELD:
                    c = u'+';
                    break;
                case UNUM_EXPONENT_SYMBOL_FIELD:
                    c = u'E';
                    break;
                case UNUM_DECIMAL_SEPARATOR_FIELD:
                    c = u'.';
                    break;
                case UNUM_GROUPING_SEPARATOR_FIELD:
                    c = u',';
                    break;
                case UNUM_PERCENT_FIELD:
                    c = u'%';
                    break;
                case UNUM_PERMILL_FIELD:
                    c = u'‰';
                    break;
                case UNUM_CURRENCY_FIELD:
                    c = u'$';
                    break;
                default:
                    c = u'?';
                    break;
            }
            sb.append(c);
        }
    }
    sb.append(u"]>", -1);
    return sb;
}